

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O0

string * __thiscall
si9ma::BinaryTree::in_order_serial_abi_cxx11_
          (string *__return_storage_ptr__,BinaryTree *this,TreeNode *head)

{
  TreeNode *head_00;
  TreeNode *head_01;
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  _Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_50;
  allocator local_19;
  BinaryTree *local_18;
  TreeNode *head_local;
  string *res;
  
  local_18 = this;
  head_local = (TreeNode *)__return_storage_ptr__;
  if (this == (BinaryTree *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"#_",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    local_50.
    super__Hash_node_value<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    .
    super__Hash_node_value_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_storage._M_storage.__data[0x1b] = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::to_string((string *)local_70,*(int *)local_18);
    std::operator+((_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)(local_70 + 0x20),
                   (_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    *)local_70,"_");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)(local_70 + 0x20));
    std::__cxx11::string::~string((string *)(local_70 + 0x20));
    std::__cxx11::string::~string((string *)local_70);
    in_order_serial_abi_cxx11_((string *)local_90,*(BinaryTree **)(local_18 + 8),head_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    in_order_serial_abi_cxx11_((string *)local_b0,*(BinaryTree **)(local_18 + 0x10),head_01);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

string BinaryTree::in_order_serial(const TreeNode *head) {
        if (head == nullptr)
            return "#_";

        string res;
        res += to_string(head->value) + "_";
        res += in_order_serial(head->left);
        res += in_order_serial(head->right);

        return res;
    }